

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastF64P2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint size;
  RepeatedField<unsigned_long> *out;
  char *pcVar2;
  uint *puVar3;
  pair<const_char_*,_int> pVar4;
  
  if (data.field_0._0_2_ != 0) {
    pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar2;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar3 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar3 & 3) != 0) {
      AlignFail();
    }
    *puVar3 = *puVar3 | (uint)hasbits;
  }
  out = (RepeatedField<unsigned_long> *)
        ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)out & 7) == 0) {
    bVar1 = ptr[2];
    size = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar4 = ReadSizeFallback(ptr + 2,(uint)bVar1);
      size = pVar4.second;
      pcVar2 = pVar4.first;
    }
    else {
      pcVar2 = ptr + 3;
    }
    pcVar2 = EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                       (&ctx->super_EpsCopyInputStream,pcVar2,size,out);
    return pcVar2;
  }
  AlignFail(out);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF64P2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedFixed<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}